

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::QToolButton(QToolButton *this,QWidget *parent)

{
  QAbstractButtonPrivate *this_00;
  
  this_00 = (QAbstractButtonPrivate *)operator_new(0x310);
  QAbstractButtonPrivate::QAbstractButtonPrivate(this_00,DefaultType);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QToolButtonPrivate_0080d038;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x8 = 0xffffffffffffffff;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x20 = 0;
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,this_00,parent);
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget = &PTR_metaObject_0080cd50;
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__QToolButton_0080cf20;
  QToolButtonPrivate::init
            (*(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QToolButton::QToolButton(QWidget * parent)
    : QAbstractButton(*new QToolButtonPrivate, parent)
{
    Q_D(QToolButton);
    d->init();
}